

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmSourceFile * __thiscall cmMakefile::GetSource(cmMakefile *this,string *sourceName)

{
  bool bVar1;
  pointer ppcVar2;
  cmSourceFile *this_00;
  cmSourceFileLocation sfl;
  cmSourceFileLocation local_70;
  
  cmSourceFileLocation::cmSourceFileLocation(&local_70,this,sourceName);
  ppcVar2 = (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppcVar2 ==
        (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (cmSourceFile *)0x0;
      break;
    }
    this_00 = *ppcVar2;
    bVar1 = cmSourceFile::Matches(this_00,&local_70);
    ppcVar2 = ppcVar2 + 1;
  } while (!bVar1);
  cmSourceFileLocation::~cmSourceFileLocation(&local_70);
  return this_00;
}

Assistant:

cmSourceFile* cmMakefile::GetSource(const std::string& sourceName) const
{
  cmSourceFileLocation sfl(this, sourceName);
  for (std::vector<cmSourceFile*>::const_iterator sfi =
         this->SourceFiles.begin();
       sfi != this->SourceFiles.end(); ++sfi) {
    cmSourceFile* sf = *sfi;
    if (sf->Matches(sfl)) {
      return sf;
    }
  }
  return CM_NULLPTR;
}